

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall ChainstateManager::MaybeRebalanceCaches(ChainstateManager *this)

{
  string_view source_file;
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  size_t unaff_retaddr;
  Chainstate *in_stack_00000008;
  ChainstateManager *in_stack_00000030;
  ConstevalFormatString<0U> in_stack_00000038;
  bool snapshot_usable;
  size_t in_stack_00000040;
  bool ibd_usable;
  undefined1 in_stack_00000050 [16];
  Level in_stack_00000130;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  int in_stack_ffffffffffffff8c;
  Chainstate *in_stack_ffffffffffffff90;
  ChainstateManager *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  bool local_41;
  LogFlags in_stack_fffffffffffffff0;
  size_t coinsdb_size;
  
  coinsdb_size = *(size_t *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,(AnnotatedMixin<std::recursive_mutex> *)0x7dada4);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = IsUsable(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar2 = IsUsable(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_41 = true;
  if (!bVar1) {
    local_41 = bVar2;
  }
  if (local_41 == false) {
    __assert_fail("ibd_usable || snapshot_usable",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1832,"void ChainstateManager::MaybeRebalanceCaches()");
  }
  if ((!bVar1) || (bVar2)) {
    if ((!bVar2) || (bVar1)) {
      if ((bVar1) && (bVar2)) {
        bVar1 = IsInitialBlockDownload(in_stack_00000030);
        if (bVar1) {
          std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
          std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
        }
        else {
          std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
          std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                    ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
        }
      }
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      uVar3 = 2;
      source_file._M_str = (char *)this;
      source_file._M_len = in_stack_00000040;
      LogPrintFormatInternal<>
                ((string_view)in_stack_00000050,source_file,(int)(coinsdb_size >> 0x20),
                 in_stack_fffffffffffffff0,in_stack_00000130,in_stack_00000038);
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,uVar3));
      Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
    }
  }
  else {
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    Chainstate::ResizeCoinsCaches(in_stack_00000008,unaff_retaddr,coinsdb_size);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != coinsdb_size) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::MaybeRebalanceCaches()
{
    AssertLockHeld(::cs_main);
    bool ibd_usable = this->IsUsable(m_ibd_chainstate.get());
    bool snapshot_usable = this->IsUsable(m_snapshot_chainstate.get());
    assert(ibd_usable || snapshot_usable);

    if (ibd_usable && !snapshot_usable) {
        // Allocate everything to the IBD chainstate. This will always happen
        // when we are not using a snapshot.
        m_ibd_chainstate->ResizeCoinsCaches(m_total_coinstip_cache, m_total_coinsdb_cache);
    }
    else if (snapshot_usable && !ibd_usable) {
        // If background validation has completed and snapshot is our active chain...
        LogPrintf("[snapshot] allocating all cache to the snapshot chainstate\n");
        // Allocate everything to the snapshot chainstate.
        m_snapshot_chainstate->ResizeCoinsCaches(m_total_coinstip_cache, m_total_coinsdb_cache);
    }
    else if (ibd_usable && snapshot_usable) {
        // If both chainstates exist, determine who needs more cache based on IBD status.
        //
        // Note: shrink caches first so that we don't inadvertently overwhelm available memory.
        if (IsInitialBlockDownload()) {
            m_ibd_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.05, m_total_coinsdb_cache * 0.05);
            m_snapshot_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.95, m_total_coinsdb_cache * 0.95);
        } else {
            m_snapshot_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.05, m_total_coinsdb_cache * 0.05);
            m_ibd_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.95, m_total_coinsdb_cache * 0.95);
        }
    }
}